

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_SetTimer(Uint32 interval,SDL12_TimerCallback callback)

{
  Uint32 UVar1;
  SDL12_TimerCallback callback_local;
  Uint32 interval_local;
  
  if (SDL_SetTimer::compat_timer != 0) {
    (*SDL20_RemoveTimer)(SDL_SetTimer::compat_timer);
    SDL_SetTimer::compat_timer = 0;
  }
  if ((interval != 0) && (callback != (SDL12_TimerCallback)0x0)) {
    UVar1 = RoundTimerTo12Resolution(interval);
    SDL_SetTimer::compat_timer = (*SDL20_AddTimer)(UVar1,SetTimerCallback12,callback);
    if (SDL_SetTimer::compat_timer == 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

SDLCALL
SDL_SetTimer(Uint32 interval, SDL12_TimerCallback callback)
{
    static SDL_TimerID compat_timer;

    if (compat_timer) {
        SDL20_RemoveTimer(compat_timer);
        compat_timer = 0;
    }

    if (interval && callback) {
        interval = RoundTimerTo12Resolution(interval);
        compat_timer = SDL20_AddTimer(interval, SetTimerCallback12, (void*)callback);
        if (!compat_timer) {
            return -1;
        }
    }
    return 0;
}